

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall
kj::_::TransformPromiseNodeBase::get(TransformPromiseNodeBase *this,ExceptionOrValue *output)

{
  NullableValue<kj::Exception> exception;
  NullableValue<kj::Exception> local_2d8;
  NullableValue<kj::Exception> local_178;
  
  local_2d8._0_8_ = &PTR_run_003a3e98;
  local_2d8.field_1.value.ownFile.content.ptr = (char *)this;
  local_2d8.field_1.value.ownFile.content.size_ = (size_t)output;
  runCatchingExceptions((Maybe<kj::Exception> *)&local_178,(Runnable *)&local_2d8);
  NullableValue<kj::Exception>::NullableValue(&local_2d8,&local_178);
  NullableValue<kj::Exception>::~NullableValue(&local_178);
  if (local_2d8.isSet == true) {
    ExceptionOrValue::addException(output,&local_2d8.field_1.value);
  }
  NullableValue<kj::Exception>::~NullableValue(&local_2d8);
  return;
}

Assistant:

void TransformPromiseNodeBase::get(ExceptionOrValue& output) noexcept {
  KJ_IF_MAYBE(exception, kj::runCatchingExceptions([&]() {
    getImpl(output);
    dropDependency();
  })) {
    output.addException(kj::mv(*exception));
  }
}